

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsLoadMS::Cleanup(BasicAllTargetsLoadMS *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  iVar1 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glViewport
            (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar1) + 4));
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		return NO_ERROR;
	}